

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void sortOpts(StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptMap,
             SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *Opts,bool ShowHidden)

{
  StringMapEntryBase **ppSVar1;
  ushort uVar2;
  ulong uVar3;
  StringMapEntryBase **ppSVar4;
  SmallPtrSet<llvm::cl::Option_*,_32U> OptionSet;
  pair<llvm::SmallPtrSetIterator<llvm::cl::Option_*>,_bool> local_168;
  SmallPtrSetImpl<llvm::cl::Option_*> local_150;
  void *local_130 [32];
  
  local_150.super_SmallPtrSetImplBase.SmallArray = local_130;
  local_150.super_SmallPtrSetImplBase.CurArraySize = 0x20;
  local_150.super_SmallPtrSetImplBase.NumNonEmpty = 0;
  local_150.super_SmallPtrSetImplBase.NumTombstones = 0;
  ppSVar1 = (OptMap->super_StringMapImpl).TheTable;
  uVar3 = (ulong)(OptMap->super_StringMapImpl).NumBuckets;
  ppSVar4 = ppSVar1;
  if (uVar3 != 0) {
    for (; (*ppSVar4 == (StringMapEntryBase *)0x0 ||
           (*ppSVar4 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar4 = ppSVar4 + 1) {
    }
  }
  local_150.super_SmallPtrSetImplBase.CurArray = local_150.super_SmallPtrSetImplBase.SmallArray;
  if (ppSVar4 != ppSVar1 + uVar3) {
    do {
      uVar2 = *(ushort *)((*ppSVar4)[1].StrLen + 0xc) >> 5 & 3;
      if (((uVar2 != 1 || ShowHidden) && uVar2 != 2) &&
         (llvm::SmallPtrSetImpl<llvm::cl::Option_*>::insert
                    (&local_168,&local_150,(Option *)(*ppSVar4)[1].StrLen), local_168.second == true
         )) {
        local_168.first.super_SmallPtrSetIteratorImpl.Bucket = (void **)(*ppSVar4 + 2);
        local_168.first.super_SmallPtrSetIteratorImpl.End = (void **)(*ppSVar4)[1].StrLen;
        llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>::push_back
                  (&Opts->
                    super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>
                   ,(pair<const_char_*,_llvm::cl::Option_*> *)&local_168);
      }
      do {
        do {
          ppSVar4 = ppSVar4 + 1;
        } while (*ppSVar4 == (StringMapEntryBase *)0x0);
      } while (*ppSVar4 == (StringMapEntryBase *)0xfffffffffffffff8);
    } while (ppSVar4 != ppSVar1 + uVar3);
  }
  uVar3 = (ulong)(Opts->
                 super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>).
                 super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
                 super_SmallVectorBase.Size;
  if (1 < uVar3) {
    qsort((Opts->super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>).
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
          super_SmallVectorBase.BeginX,uVar3,0x10,OptNameCompare);
  }
  if (local_150.super_SmallPtrSetImplBase.CurArray != local_150.super_SmallPtrSetImplBase.SmallArray
     ) {
    free(local_150.super_SmallPtrSetImplBase.CurArray);
  }
  return;
}

Assistant:

static void sortOpts(StringMap<Option *> &OptMap,
                     SmallVectorImpl<std::pair<const char *, Option *>> &Opts,
                     bool ShowHidden) {
  SmallPtrSet<Option *, 32> OptionSet; // Duplicate option detection.

  for (StringMap<Option *>::iterator I = OptMap.begin(), E = OptMap.end();
       I != E; ++I) {
    // Ignore really-hidden options.
    if (I->second->getOptionHiddenFlag() == ReallyHidden)
      continue;

    // Unless showhidden is set, ignore hidden flags.
    if (I->second->getOptionHiddenFlag() == Hidden && !ShowHidden)
      continue;

    // If we've already seen this option, don't add it to the list again.
    if (!OptionSet.insert(I->second).second)
      continue;

    Opts.push_back(
        std::pair<const char *, Option *>(I->getKey().data(), I->second));
  }

  // Sort the options list alphabetically.
  array_pod_sort(Opts.begin(), Opts.end(), OptNameCompare);
}